

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void jsonAppendRawNZ(JsonString *p,char *zIn,u32 N)

{
  ulong __n;
  
  __n = (ulong)N;
  if (p->nUsed + __n < p->nAlloc) {
    memcpy(p->zBuf + p->nUsed,zIn,__n);
    p->nUsed = p->nUsed + __n;
    return;
  }
  jsonStringExpandAndAppend(p,zIn,N);
  return;
}

Assistant:

static void jsonAppendRawNZ(JsonString *p, const char *zIn, u32 N){
  assert( N>0 );
  if( N+p->nUsed >= p->nAlloc ){
    jsonStringExpandAndAppend(p,zIn,N);
  }else{
    memcpy(p->zBuf+p->nUsed, zIn, N);
    p->nUsed += N;
  }
}